

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_str_delete_runes(nk_str *s,int pos,int len)

{
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  char *pcStack_38;
  int unused;
  char *end;
  char *begin;
  void *pvStack_20;
  nk_rune unicode;
  char *temp;
  int len_local;
  int pos_local;
  nk_str *s_local;
  
  temp._0_4_ = len;
  temp._4_4_ = pos;
  _len_local = s;
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x16ed,"void nk_str_delete_runes(struct nk_str *, int, int)");
  }
  if (s->len < pos + len) {
    __assert_fail("s->len >= pos + len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x16ee,"void nk_str_delete_runes(struct nk_str *, int, int)");
  }
  if (s->len < pos + len) {
    if (s->len - pos < s->len) {
      local_40 = s->len - pos;
    }
    else {
      local_40 = s->len;
    }
    if (local_40 < 0) {
      local_44 = 0;
    }
    else {
      if (s->len - pos < s->len) {
        local_48 = s->len - pos;
      }
      else {
        local_48 = s->len;
      }
      local_44 = local_48;
    }
    temp._0_4_ = local_44;
  }
  if ((int)temp != 0) {
    pvStack_20 = (s->buffer).memory.ptr;
    end = nk_str_at_rune(s,pos,(nk_rune *)((long)&begin + 4),&local_3c);
    if (end != (char *)0x0) {
      (_len_local->buffer).memory.ptr = end;
      pcStack_38 = nk_str_at_rune(_len_local,(int)temp,(nk_rune *)((long)&begin + 4),&local_3c);
      (_len_local->buffer).memory.ptr = pvStack_20;
      if (pcStack_38 != (char *)0x0) {
        nk_str_delete_chars(_len_local,(int)end - (int)pvStack_20,(int)pcStack_38 - (int)end);
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_str_delete_runes(struct nk_str *s, int pos, int len)
{
    char *temp;
    nk_rune unicode;
    char *begin;
    char *end;
    int unused;

    NK_ASSERT(s);
    NK_ASSERT(s->len >= pos + len);
    if (s->len < pos + len)
        len = NK_CLAMP(0, (s->len - pos), s->len);
    if (!len) return;

    temp = (char *)s->buffer.memory.ptr;
    begin = nk_str_at_rune(s, pos, &unicode, &unused);
    if (!begin) return;
    s->buffer.memory.ptr = begin;
    end = nk_str_at_rune(s, len, &unicode, &unused);
    s->buffer.memory.ptr = temp;
    if (!end) return;
    nk_str_delete_chars(s, (int)(begin - temp), (int)(end - begin));
}